

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O2

unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
__thiscall sf2cute::SoundFontWriter::MakeInfoListChunk(SoundFontWriter *this)

{
  SoundFontWriter SVar1;
  long lVar2;
  long *in_RSI;
  allocator<char> local_2a9;
  _Head_base<0UL,_sf2cute::RIFFChunkInterface_*,_false> local_2a8;
  SoundFontWriter local_2a0;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::make_unique<sf2cute::RIFFListChunk,char_const(&)[5]>((char (*) [5])&local_2a0);
  SVar1.file_ = local_2a0.file_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ifil",&local_2a9);
  MakeVersionChunk((SoundFontWriter *)&local_2a8,&local_38,(SFVersionTag)0x10002);
  RIFFListChunk::AddSubchunk
            ((RIFFListChunk *)SVar1.file_,
             (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
              *)&local_2a8);
  if (local_2a8._M_head_impl != (RIFFChunkInterface *)0x0) {
    (*(local_2a8._M_head_impl)->_vptr_RIFFChunkInterface[1])();
  }
  local_2a8._M_head_impl = (RIFFChunkInterface *)0x0;
  std::__cxx11::string::~string((string *)&local_38);
  SVar1.file_ = local_2a0.file_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"isng",&local_2a9);
  std::__cxx11::string::substr((ulong)&local_78,*in_RSI + 0x48);
  MakeZSTRChunk((SoundFontWriter *)&local_2a8,&local_58,&local_78);
  RIFFListChunk::AddSubchunk
            ((RIFFListChunk *)SVar1.file_,
             (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
              *)&local_2a8);
  if (local_2a8._M_head_impl != (RIFFChunkInterface *)0x0) {
    (*(local_2a8._M_head_impl)->_vptr_RIFFChunkInterface[1])();
  }
  local_2a8._M_head_impl = (RIFFChunkInterface *)0x0;
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  SVar1.file_ = local_2a0.file_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"INAM",&local_2a9);
  std::__cxx11::string::substr((ulong)&local_b8,*in_RSI + 0x68);
  MakeZSTRChunk((SoundFontWriter *)&local_2a8,&local_98,&local_b8);
  RIFFListChunk::AddSubchunk
            ((RIFFListChunk *)SVar1.file_,
             (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
              *)&local_2a8);
  if (local_2a8._M_head_impl != (RIFFChunkInterface *)0x0) {
    (*(local_2a8._M_head_impl)->_vptr_RIFFChunkInterface[1])();
  }
  local_2a8._M_head_impl = (RIFFChunkInterface *)0x0;
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  SVar1.file_ = local_2a0.file_;
  lVar2 = *in_RSI;
  if (*(long *)(lVar2 + 0x90) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"irom",&local_2a9);
    std::__cxx11::string::substr((ulong)&local_f8,*in_RSI + 0x88);
    MakeZSTRChunk((SoundFontWriter *)&local_2a8,&local_d8,&local_f8);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)SVar1.file_,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2a8);
    if (local_2a8._M_head_impl != (RIFFChunkInterface *)0x0) {
      (*(local_2a8._M_head_impl)->_vptr_RIFFChunkInterface[1])();
    }
    local_2a8._M_head_impl = (RIFFChunkInterface *)0x0;
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    lVar2 = *in_RSI;
  }
  SVar1.file_ = local_2a0.file_;
  if (*(char *)(lVar2 + 0xac) == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"iver",&local_2a9);
    MakeVersionChunk((SoundFontWriter *)&local_2a8,&local_118,*(SFVersionTag *)(*in_RSI + 0xa8));
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)SVar1.file_,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2a8);
    if (local_2a8._M_head_impl != (RIFFChunkInterface *)0x0) {
      (*(local_2a8._M_head_impl)->_vptr_RIFFChunkInterface[1])();
    }
    local_2a8._M_head_impl = (RIFFChunkInterface *)0x0;
    std::__cxx11::string::~string((string *)&local_118);
    lVar2 = *in_RSI;
  }
  SVar1.file_ = local_2a0.file_;
  if (*(long *)(lVar2 + 0xb8) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"ICRD",&local_2a9);
    std::__cxx11::string::substr((ulong)&local_158,*in_RSI + 0xb0);
    MakeZSTRChunk((SoundFontWriter *)&local_2a8,&local_138,&local_158);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)SVar1.file_,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2a8);
    if (local_2a8._M_head_impl != (RIFFChunkInterface *)0x0) {
      (*(local_2a8._M_head_impl)->_vptr_RIFFChunkInterface[1])();
    }
    local_2a8._M_head_impl = (RIFFChunkInterface *)0x0;
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    lVar2 = *in_RSI;
  }
  SVar1.file_ = local_2a0.file_;
  if (*(long *)(lVar2 + 0xd8) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"IENG",&local_2a9);
    std::__cxx11::string::substr((ulong)&local_198,*in_RSI + 0xd0);
    MakeZSTRChunk((SoundFontWriter *)&local_2a8,&local_178,&local_198);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)SVar1.file_,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2a8);
    if (local_2a8._M_head_impl != (RIFFChunkInterface *)0x0) {
      (*(local_2a8._M_head_impl)->_vptr_RIFFChunkInterface[1])();
    }
    local_2a8._M_head_impl = (RIFFChunkInterface *)0x0;
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    lVar2 = *in_RSI;
  }
  SVar1.file_ = local_2a0.file_;
  if (*(long *)(lVar2 + 0xf8) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"IPRD",&local_2a9);
    std::__cxx11::string::substr((ulong)&local_1d8,*in_RSI + 0xf0);
    MakeZSTRChunk((SoundFontWriter *)&local_2a8,&local_1b8,&local_1d8);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)SVar1.file_,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2a8);
    if (local_2a8._M_head_impl != (RIFFChunkInterface *)0x0) {
      (*(local_2a8._M_head_impl)->_vptr_RIFFChunkInterface[1])();
    }
    local_2a8._M_head_impl = (RIFFChunkInterface *)0x0;
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1b8);
    lVar2 = *in_RSI;
  }
  SVar1.file_ = local_2a0.file_;
  if (*(long *)(lVar2 + 0x118) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"ICOP",&local_2a9);
    std::__cxx11::string::substr((ulong)&local_218,*in_RSI + 0x110);
    MakeZSTRChunk((SoundFontWriter *)&local_2a8,&local_1f8,&local_218);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)SVar1.file_,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2a8);
    if (local_2a8._M_head_impl != (RIFFChunkInterface *)0x0) {
      (*(local_2a8._M_head_impl)->_vptr_RIFFChunkInterface[1])();
    }
    local_2a8._M_head_impl = (RIFFChunkInterface *)0x0;
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    lVar2 = *in_RSI;
  }
  SVar1.file_ = local_2a0.file_;
  if (*(long *)(lVar2 + 0x138) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"ICMT",&local_2a9);
    std::__cxx11::string::substr((ulong)&local_258,*in_RSI + 0x130);
    MakeZSTRChunk((SoundFontWriter *)&local_2a8,&local_238,&local_258);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)SVar1.file_,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2a8);
    if (local_2a8._M_head_impl != (RIFFChunkInterface *)0x0) {
      (*(local_2a8._M_head_impl)->_vptr_RIFFChunkInterface[1])();
    }
    local_2a8._M_head_impl = (RIFFChunkInterface *)0x0;
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    lVar2 = *in_RSI;
  }
  SVar1.file_ = local_2a0.file_;
  if (*(long *)(lVar2 + 0x158) != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"ISFT",&local_2a9);
    std::__cxx11::string::substr((ulong)&local_298,*in_RSI + 0x150);
    MakeZSTRChunk((SoundFontWriter *)&local_2a8,&local_278,&local_298);
    RIFFListChunk::AddSubchunk
              ((RIFFListChunk *)SVar1.file_,
               (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                *)&local_2a8);
    if (local_2a8._M_head_impl != (RIFFChunkInterface *)0x0) {
      (*(local_2a8._M_head_impl)->_vptr_RIFFChunkInterface[1])();
    }
    local_2a8._M_head_impl = (RIFFChunkInterface *)0x0;
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_278);
  }
  this->file_ = (SoundFont *)local_2a0;
  return (__uniq_ptr_data<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>,_true,_true>
          )(__uniq_ptr_data<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<RIFFChunkInterface> SoundFontWriter::MakeInfoListChunk() {
  std::unique_ptr<RIFFListChunk> info = std::make_unique<RIFFListChunk>("INFO");

  // Mandatory chunks:

  info->AddSubchunk(MakeVersionChunk("ifil", SFVersionTag(2, 1)));

  info->AddSubchunk(MakeZSTRChunk("isng", file().sound_engine().substr(0, SoundFont::kInfoTextMaxLength)));

  info->AddSubchunk(MakeZSTRChunk("INAM", file().bank_name().substr(0, SoundFont::kInfoTextMaxLength)));

  // Optional chunks:

  if (file().has_rom_name()) {
    info->AddSubchunk(MakeZSTRChunk("irom", file().rom_name().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_rom_version()) {
    info->AddSubchunk(MakeVersionChunk("iver", file().rom_version()));
  }

  if (file().has_creation_date()) {
    info->AddSubchunk(MakeZSTRChunk("ICRD", file().creation_date().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_engineers()) {
    info->AddSubchunk(MakeZSTRChunk("IENG", file().engineers().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_product()) {
    info->AddSubchunk(MakeZSTRChunk("IPRD", file().product().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_copyright()) {
    info->AddSubchunk(MakeZSTRChunk("ICOP", file().copyright().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_comment()) {
    info->AddSubchunk(MakeZSTRChunk("ICMT", file().comment().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_software()) {
    info->AddSubchunk(MakeZSTRChunk("ISFT", file().software().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  return std::move(info);
}